

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O1

void __thiscall QEvdevTouchScreenHandler::~QEvdevTouchScreenHandler(QEvdevTouchScreenHandler *this)

{
  int __fd;
  QEvdevTouchScreenData *this_00;
  int iVar1;
  int *piVar2;
  
  *(undefined ***)this = &PTR_metaObject_0011c2b8;
  __fd = *(int *)(this + 0x18);
  if (-1 < __fd) {
    do {
      iVar1 = close(__fd);
      if (iVar1 != -1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  this_00 = *(QEvdevTouchScreenData **)(this + 0x20);
  if (this_00 != (QEvdevTouchScreenData *)0x0) {
    QEvdevTouchScreenData::~QEvdevTouchScreenData(this_00);
    operator_delete(this_00,0x160);
  }
  unregisterPointingDevice(this);
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QEvdevTouchScreenHandler::~QEvdevTouchScreenHandler()
{
#if QT_CONFIG(mtdev)
    if (m_mtdev) {
        mtdev_close(m_mtdev);
        free(m_mtdev);
    }
#endif

    if (m_fd >= 0)
        QT_CLOSE(m_fd);

    delete d;

    unregisterPointingDevice();
}